

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

void ReportOnFunctionSelectError
               (ExpressionContext *ctx,SynBase *source,char *errorBuf,uint errorBufSize,
               char *messageStart,ArrayView<FunctionValue> functions)

{
  undefined4 uStack_3c;
  undefined4 uStack_2c;
  
  ReportOnFunctionSelectError
            (ctx,source,errorBuf,errorBufSize,messageStart,(InplaceStr)ZEXT816(0),functions,
             (IntrusiveList<TypeHandle>)ZEXT816(0),
             (ArrayView<ArgumentData>)(ZEXT416(uStack_2c) << 0x60),
             (ArrayView<unsigned_int>)(ZEXT416(uStack_3c) << 0x60),0,false);
  return;
}

Assistant:

void ReportOnFunctionSelectError(ExpressionContext &ctx, SynBase *source, char* errorBuf, unsigned errorBufSize, const char *messageStart, ArrayView<FunctionValue> functions)
{
	IntrusiveList<TypeHandle> generics;
	ArrayView<ArgumentData> arguments;
	ArrayView<unsigned> ratings;

	ReportOnFunctionSelectError(ctx, source, errorBuf, errorBufSize, messageStart, InplaceStr(), functions, generics, arguments, ratings, 0, false);
}